

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O3

Vec_Int_t * Saig_ManCbaFindReason(Saig_ManCba_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  Vec_Int_t *vPrios;
  int *__s;
  long lVar9;
  Vec_Int_t *vReasons;
  int *piVar10;
  int iVar11;
  uint uVar12;
  Vec_Ptr_t *pVVar13;
  long lVar14;
  uint uVar15;
  Aig_Man_t *pAVar16;
  uint uVar17;
  uint uVar18;
  byte bVar19;
  
  pAVar16 = p->pFrames;
  uVar8 = pAVar16->vObjs->nSize;
  vPrios = (Vec_Int_t *)malloc(0x10);
  uVar18 = 0x10;
  if (0xe < uVar8 - 1) {
    uVar18 = uVar8;
  }
  vPrios->nCap = uVar18;
  if (uVar18 == 0) {
    vPrios->pArray = (int *)0x0;
    vPrios->nSize = uVar8;
  }
  else {
    __s = (int *)malloc((long)(int)uVar18 << 2);
    vPrios->pArray = __s;
    vPrios->nSize = uVar8;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)(int)uVar8 << 2);
      goto LAB_006111e9;
    }
  }
  __s = (int *)0x0;
LAB_006111e9:
  puVar1 = &pAVar16->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  pAVar16 = p->pFrames;
  pVVar13 = pAVar16->vCis;
  if (0 < pVVar13->nSize) {
    lVar9 = 0;
    lVar14 = 0;
    do {
      uVar18 = p->vMapPiF2A->nSize;
      if (((int)uVar18 <= lVar9) || ((ulong)uVar18 <= lVar9 + 1U)) goto LAB_006114bd;
      piVar10 = p->vMapPiF2A->pArray;
      pAVar3 = p->pCex;
      iVar11 = pAVar3->nRegs + piVar10[lVar9] + pAVar3->nPis * piVar10[lVar9 + 1];
      lVar4 = *(long *)((long)pVVar13->pArray + lVar9 * 4);
      *(ulong *)(lVar4 + 0x18) =
           (*(ulong *)(lVar4 + 0x18) & 0xfffffffffffffff7) +
           (ulong)((uint)(&pAVar3[1].iPo)[iVar11 >> 5] >> ((byte)iVar11 & 0x1f) & 1) * 8;
      iVar11 = *(int *)(lVar4 + 0x24);
      if (((long)iVar11 < 0) || ((int)uVar8 <= iVar11)) goto LAB_006114dc;
      __s[iVar11] = (int)lVar14;
      lVar14 = lVar14 + 1;
      pAVar16 = p->pFrames;
      pVVar13 = pAVar16->vCis;
      lVar9 = lVar9 + 2;
    } while (lVar14 < pVVar13->nSize);
  }
  pVVar13 = pAVar16->vObjs;
  if (0 < pVVar13->nSize) {
    lVar9 = 0;
    do {
      pvVar5 = pVVar13->pArray[lVar9];
      if ((pvVar5 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar5 + 0x18) & 7) - 7))
      {
        uVar6 = *(ulong *)((long)pvVar5 + 8);
        if (uVar6 == 0) {
LAB_006114bd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar11 = *(int *)((uVar6 & 0xfffffffffffffffe) + 0x24);
        if ((((long)iVar11 < 0) || ((int)uVar8 <= iVar11)) ||
           (uVar7 = *(ulong *)((long)pvVar5 + 0x10), uVar7 == 0)) goto LAB_006114bd;
        uVar18 = *(uint *)((uVar7 & 0xfffffffffffffffe) + 0x24);
        if (((long)(int)uVar18 < 0) || (uVar8 <= uVar18)) goto LAB_006114bd;
        uVar15 = (uint)uVar6 & 1;
        uVar17 = *(uint *)((uVar6 & 0xfffffffffffffffe) + 0x18) >> 3 & 1;
        iVar11 = __s[iVar11];
        iVar2 = __s[(int)uVar18];
        uVar18 = *(uint *)((uVar7 & 0xfffffffffffffffe) + 0x18) >> 3 ^ (uint)uVar7;
        bVar19 = (byte)uVar18 & uVar15 != uVar17;
        *(ulong *)((long)pvVar5 + 0x18) =
             (*(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffff7) + (ulong)bVar19 * 8;
        if (bVar19 == 1) {
          uVar12 = *(uint *)((long)pvVar5 + 0x24);
          if (((int)uVar12 < 0) || (uVar8 <= uVar12)) {
LAB_006114dc:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          if (iVar11 <= iVar2) {
            iVar11 = iVar2;
          }
        }
        else {
          uVar18 = uVar18 & 1;
          if ((uVar15 == uVar17) && (uVar18 != 0)) {
            uVar12 = *(uint *)((long)pvVar5 + 0x24);
            if (((int)uVar12 < 0) || (uVar8 <= uVar12)) goto LAB_006114dc;
          }
          else {
            uVar12 = *(uint *)((long)pvVar5 + 0x24);
            if ((uVar15 == uVar17) || (uVar18 != 0)) {
              if (uVar8 <= uVar12 || (int)uVar12 < 0) goto LAB_006114dc;
              if (iVar2 <= iVar11) {
                iVar11 = iVar2;
              }
            }
            else {
              iVar11 = iVar2;
              if (uVar8 <= uVar12 || (int)uVar12 < 0) goto LAB_006114dc;
            }
          }
        }
        __s[uVar12] = iVar11;
      }
      lVar9 = lVar9 + 1;
      pAVar16 = p->pFrames;
      pVVar13 = pAVar16->vObjs;
    } while (lVar9 < pVVar13->nSize);
  }
  if (pAVar16->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar5 = *pAVar16->vCos->pArray;
  uVar18 = (int)*(ulong *)((long)pvVar5 + 8) * 8 & 8;
  uVar8 = *(uint *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x18) & 8;
  *(ulong *)((long)pvVar5 + 0x18) =
       *(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffff7 | (ulong)(uVar18 ^ uVar8);
  if (uVar8 != uVar18) {
    __assert_fail("!pObj->fPhase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x15c,"Vec_Int_t *Saig_ManCbaFindReason(Saig_ManCba_t *)");
  }
  vReasons = (Vec_Int_t *)malloc(0x10);
  vReasons->nCap = 100;
  vReasons->nSize = 0;
  piVar10 = (int *)malloc(400);
  vReasons->pArray = piVar10;
  Aig_ManIncrementTravId(p->pFrames);
  Saig_ManCbaFindReason_rec
            (p->pFrames,(Aig_Obj_t *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe),vPrios,
             vReasons);
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(vPrios);
  return vReasons;
}

Assistant:

Vec_Int_t * Saig_ManCbaFindReason( Saig_ManCba_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vPrios, * vReasons;
    int i;

    // set PI values according to CEX
    vPrios = Vec_IntStartFull( Aig_ManObjNumMax(p->pFrames) );
    Aig_ManConst1(p->pFrames)->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), i );
    }

    // traverse and set the priority
    Aig_ManForEachNode( p->pFrames, pObj, i )
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        int iPrio0  = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
        int iPrio1  = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
        pObj->fPhase = fPhase0 && fPhase1;
        if ( fPhase0 && fPhase1 ) // both are one
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MaxInt(iPrio0, iPrio1) );
        else if ( !fPhase0 && fPhase1 ) 
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio0 );
        else if ( fPhase0 && !fPhase1 )
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio1 );
        else // both are zero
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MinInt(iPrio0, iPrio1) );
    }
    // check the property output
    pObj = Aig_ManCo( p->pFrames, 0 );
    pObj->fPhase = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
    assert( !pObj->fPhase );

    // select the reason
    vReasons = Vec_IntAlloc( 100 );
    Aig_ManIncrementTravId( p->pFrames );
    Saig_ManCbaFindReason_rec( p->pFrames, Aig_ObjFanin0(pObj), vPrios, vReasons );
    Vec_IntFree( vPrios );
//    assert( !Aig_ObjIsTravIdCurrent(p->pFrames, Aig_ManConst1(p->pFrames)) );
    return vReasons;
}